

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_fds.c
# Opt level: O3

bool NES_FDS_Read(void *chip,UINT16 adr,UINT8 *val)

{
  byte bVar1;
  
  if ((ushort)(adr + 0xbfc0) < 0x3f) {
    bVar1 = *(byte *)((long)chip + (ulong)(adr & 0x3f) * 4 + 0x138);
  }
  else {
    if (adr == 0x4092) {
      bVar1 = *(byte *)((long)chip + 0x268);
    }
    else {
      if (adr != 0x4090) {
        return false;
      }
      bVar1 = *(byte *)((long)chip + 0x26c);
    }
    bVar1 = bVar1 | 0x40;
  }
  *val = bVar1;
  return true;
}

Assistant:

bool NES_FDS_Read(void* chip, UINT16 adr, UINT8* val)
{
	NES_FDS* fds = (NES_FDS*)chip;

	if (adr >= 0x4040 && adr < 0x407F)
	{
		// TODO: if wav_write is not enabled, the
		// read address may not be reliable? need
		// to test this on hardware.
		*val = (UINT8)fds->wave[TWAV][adr - 0x4040];
		return true;
	}

	if (adr == 0x4090)	// $4090 read volume envelope
	{
		*val = (UINT8)fds->env_out[EVOL] | 0x40;
		return true;
	}

	if (adr == 0x4092)	// $4092 read mod envelope
	{
		*val = (UINT8)fds->env_out[EMOD] | 0x40;
		return true;
	}

	return false;
}